

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::~MemoryOutputStream
          (MemoryOutputStream *this)

{
  GeneratorContextImpl *pGVar1;
  size_type sVar2;
  string *psVar3;
  undefined8 uVar4;
  byte bVar5;
  char cVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  ostream *poVar10;
  pointer ppVar11;
  long lVar12;
  char *pcVar13;
  void *__src;
  size_t __n;
  char **v1;
  long lVar14;
  char **v2;
  LogMessage *pLVar15;
  size_t sVar16;
  Arg *in_R8;
  string_view format;
  bool local_209;
  LogMessage local_188;
  Voidify local_171;
  char *local_170;
  Nullable<const_char_*> local_168;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  size_type line_length;
  char *target_ptr;
  size_type data_pos;
  size_t i;
  string local_138 [4];
  int indent_size;
  string indent_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string *local_f0;
  size_type pos;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  undefined1 local_a8 [8];
  string magic_string;
  string *target;
  undefined1 auStack_78 [7];
  bool already_present;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  it;
  undefined1 local_28 [8];
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_bool>
  pair;
  MemoryOutputStream *this_local;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__MemoryOutputStream_02a3e1c8;
  pair._16_8_ = this;
  std::
  unique_ptr<google::protobuf::io::StringOutputStream,_std::default_delete<google::protobuf::io::StringOutputStream>_>
  ::reset(&this->inner_,(pointer)0x0);
  pGVar1 = this->directory_;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[1],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&it.position_,&this->filename_,(char (*) [1])(anon_var_dwarf_37cdd0 + 5));
  absl::lts_20250127::container_internal::
  btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>_>
  ::insert((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_bool>
            *)local_28,
           (btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>_>
            *)&pGVar1->files_,(value_type *)&it.position_);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&it.position_);
  _auStack_78 = (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                 *)local_28;
  it.node_ = pair.first.node_;
  bVar5 = ((byte)pair.first.position_ ^ 0xff) & 1;
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      std::__cxx11::string::size();
      pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)&this->data_);
      if (*pcVar9 != '\n') {
        std::__cxx11::string::push_back((char)this + 'P');
      }
    }
    if (bVar5 == 0) {
      poVar10 = std::operator<<((ostream *)&std::cerr,(string *)&this->filename_);
      poVar10 = std::operator<<(poVar10,": Tried to insert into file that doesn\'t exist.");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      this->directory_->had_error_ = true;
    }
    else {
      ppVar11 = absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                ::operator->((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                              *)auStack_78);
      magic_string.field_2._8_8_ = &ppVar11->second;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_b8,"@@protoc_insertion_point($0)");
      absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
                ((Arg *)&pos,&this->insertion_point_);
      format._M_str = (char *)&pos;
      format._M_len = (size_t)local_b8._M_str;
      absl::lts_20250127::Substitute_abi_cxx11_
                ((string *)local_a8,(lts_20250127 *)local_b8._M_len,format,in_R8);
      local_f0 = (string *)
                 std::__cxx11::string::find((string *)magic_string.field_2._8_8_,(ulong)local_a8);
      if (local_f0 == (string *)0xffffffffffffffff) {
        poVar10 = std::operator<<((ostream *)&std::cerr,(string *)&this->filename_);
        poVar10 = std::operator<<(poVar10,": insertion point \"");
        poVar10 = std::operator<<(poVar10,(string *)&this->insertion_point_);
        poVar10 = std::operator<<(poVar10,"\" not found.");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        this->directory_->had_error_ = true;
      }
      else {
        indent_.field_2._M_local_buf[0xf] = '\0';
        local_209 = false;
        if ((string *)0x3 < local_f0) {
          std::__cxx11::string::substr((ulong)&local_110,magic_string.field_2._8_8_);
          indent_.field_2._M_local_buf[0xf] = '\x01';
          local_209 = std::operator==(&local_110,"/*");
        }
        if ((indent_.field_2._M_local_buf[0xf] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_110);
        }
        if (local_209 == false) {
          lVar12 = std::__cxx11::string::find_last_of((char)magic_string.field_2._8_8_,10);
          if (lVar12 == -1) {
            local_f0 = (string *)0x0;
          }
          else {
            local_f0 = (string *)(lVar12 + 1);
          }
        }
        else {
          local_f0 = local_f0 + -3;
        }
        uVar4 = magic_string.field_2._8_8_;
        psVar3 = local_f0;
        lVar12 = std::__cxx11::string::find_first_not_of
                           ((char *)magic_string.field_2._8_8_,0x1eb0223);
        std::__cxx11::string::string
                  (local_138,(string *)uVar4,(ulong)psVar3,lVar12 - (long)local_f0);
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          i._4_4_ = 0;
          for (data_pos = 0; sVar2 = data_pos, uVar8 = std::__cxx11::string::size(),
              uVar4 = magic_string.field_2._8_8_, psVar3 = local_f0, sVar2 < uVar8;
              data_pos = data_pos + 1) {
            pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)&this->data_);
            if (*pcVar9 == '\n') {
              iVar7 = std::__cxx11::string::size();
              i._4_4_ = i._4_4_ + iVar7;
            }
          }
          cVar6 = std::__cxx11::string::size();
          std::__cxx11::string::insert(uVar4,(ulong)psVar3,cVar6 + (char)i._4_4_);
          target_ptr = (char *)0x0;
          line_length = std::__cxx11::string::operator[](magic_string.field_2._8_8_);
          for (; pcVar9 = target_ptr, pcVar13 = (char *)std::__cxx11::string::size(),
              sVar2 = line_length, pcVar9 < pcVar13;
              target_ptr = absl_log_internal_check_op_result + (long)target_ptr) {
            __src = (void *)std::__cxx11::string::data();
            __n = std::__cxx11::string::size();
            memcpy((void *)sVar2,__src,__n);
            lVar12 = std::__cxx11::string::size();
            line_length = lVar12 + line_length;
            lVar12 = std::__cxx11::string::find_first_of((char)this + 'P',10);
            sVar2 = line_length;
            absl_log_internal_check_op_result =
                 (Nullable<const_char_*>)((lVar12 + 1) - (long)target_ptr);
            lVar12 = std::__cxx11::string::data();
            memcpy((void *)sVar2,target_ptr + lVar12,(size_t)absl_log_internal_check_op_result);
            line_length = (size_type)(absl_log_internal_check_op_result + line_length);
          }
          v1 = absl::lts_20250127::log_internal::GetReferenceableValue<char*>((char **)&line_length)
          ;
          lVar12 = std::__cxx11::string::operator[](magic_string.field_2._8_8_);
          lVar14 = std::__cxx11::string::size();
          local_170 = (char *)(lVar12 + lVar14 + (long)i._4_4_);
          v2 = absl::lts_20250127::log_internal::GetReferenceableValue<char*>(&local_170);
          local_168 = absl::lts_20250127::log_internal::Check_EQImpl<char*,char*>
                                (v1,v2,"target_ptr == &(*target)[pos] + data_.size() + indent_size")
          ;
          psVar3 = local_f0;
          if (local_168 != (Nullable<const_char_*>)0x0) {
            pcVar9 = absl::lts_20250127::implicit_cast<char_const*>(local_168);
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_188,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x3ab,pcVar9);
            pLVar15 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_188);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_171,pLVar15);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_188);
          }
          lVar12 = std::__cxx11::string::size();
          lVar14 = (long)i._4_4_;
          sVar16 = std::__cxx11::string::size();
          UpdateMetadata(this,&this->data_,(size_t)psVar3,lVar12 + lVar14,sVar16);
        }
        else {
          std::__cxx11::string::insert(magic_string.field_2._8_8_,local_f0);
          psVar3 = local_f0;
          sVar16 = std::__cxx11::string::size();
          UpdateMetadata(this,&this->data_,(size_t)psVar3,sVar16,0);
        }
        std::__cxx11::string::~string(local_138);
      }
      std::__cxx11::string::~string((string *)local_a8);
    }
  }
  else if (bVar5 == 0) {
    ppVar11 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
              ::operator->((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                            *)auStack_78);
    std::__cxx11::string::swap((string *)&ppVar11->second);
  }
  else if ((this->append_mode_ & 1U) == 0) {
    poVar10 = std::operator<<((ostream *)&std::cerr,(string *)&this->filename_);
    poVar10 = std::operator<<(poVar10,": Tried to write the same file twice.");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    this->directory_->had_error_ = true;
  }
  else {
    ppVar11 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
              ::operator->((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                            *)auStack_78);
    std::__cxx11::string::append((string *)&ppVar11->second);
  }
  GeneratedCodeInfo::~GeneratedCodeInfo(&this->info_to_insert_);
  std::
  unique_ptr<google::protobuf::io::StringOutputStream,_std::default_delete<google::protobuf::io::StringOutputStream>_>
  ::~unique_ptr(&this->inner_);
  std::__cxx11::string::~string((string *)&this->data_);
  std::__cxx11::string::~string((string *)&this->insertion_point_);
  std::__cxx11::string::~string((string *)&this->filename_);
  protobuf::io::ZeroCopyOutputStream::~ZeroCopyOutputStream(&this->super_ZeroCopyOutputStream);
  return;
}

Assistant:

CommandLineInterface::MemoryOutputStream::~MemoryOutputStream() {
  // Make sure all data has been written.
  inner_.reset();

  // Insert into the directory.
  auto pair = directory_->files_.insert({filename_, ""});
  auto it = pair.first;
  bool already_present = !pair.second;

  if (insertion_point_.empty()) {
    // This was just a regular Open().
    if (already_present) {
      if (append_mode_) {
        it->second.append(data_);
      } else {
        std::cerr << filename_ << ": Tried to write the same file twice."
                  << std::endl;
        directory_->had_error_ = true;
      }
      return;
    }

    it->second.swap(data_);
    return;
  }
  // This was an OpenForInsert().

  // If the data doesn't end with a clean line break, add one.
  if (!data_.empty() && data_[data_.size() - 1] != '\n') {
    data_.push_back('\n');
  }

  // Find the file we are going to insert into.
  if (!already_present) {
    std::cerr << filename_ << ": Tried to insert into file that doesn't exist."
              << std::endl;
    directory_->had_error_ = true;
    return;
  }
  std::string* target = &it->second;

  // Find the insertion point.
  std::string magic_string =
      absl::Substitute("@@protoc_insertion_point($0)", insertion_point_);
  std::string::size_type pos = target->find(magic_string);

  if (pos == std::string::npos) {
    std::cerr << filename_ << ": insertion point \"" << insertion_point_
              << "\" not found." << std::endl;
    directory_->had_error_ = true;
    return;
  }

  if ((pos > 3) && (target->substr(pos - 3, 2) == "/*")) {
    // Support for inline "/* @@protoc_insertion_point() */"
    pos = pos - 3;
  } else {
    // Seek backwards to the beginning of the line, which is where we will
    // insert the data.  Note that this has the effect of pushing the
    // insertion point down, so the data is inserted before it.  This is
    // intentional because it means that multiple insertions at the same point
    // will end up in the expected order in the final output.
    pos = target->find_last_of('\n', pos);
    if (pos == std::string::npos) {
      // Insertion point is on the first line.
      pos = 0;
    } else {
      // Advance to character after '\n'.
      ++pos;
    }
  }

  // Extract indent.
  std::string indent_(*target, pos,
                      target->find_first_not_of(" \t", pos) - pos);

  if (indent_.empty()) {
    // No indent.  This makes things easier.
    target->insert(pos, data_);
    UpdateMetadata(data_, pos, data_.size(), 0);
    return;
  }
  // Calculate how much space we need.
  int indent_size = 0;
  for (size_t i = 0; i < data_.size(); ++i) {
    if (data_[i] == '\n') indent_size += indent_.size();
  }

  // Make a hole for it.
  target->insert(pos, data_.size() + indent_size, '\0');

  // Now copy in the data.
  std::string::size_type data_pos = 0;
  char* target_ptr = &(*target)[pos];
  while (data_pos < data_.size()) {
    // Copy indent.
    memcpy(target_ptr, indent_.data(), indent_.size());
    target_ptr += indent_.size();

    // Copy line from data_.
    // We already guaranteed that data_ ends with a newline (above), so this
    // search can't fail.
    std::string::size_type line_length =
        data_.find_first_of('\n', data_pos) + 1 - data_pos;
    memcpy(target_ptr, data_.data() + data_pos, line_length);
    target_ptr += line_length;
    data_pos += line_length;
  }

  ABSL_CHECK_EQ(target_ptr, &(*target)[pos] + data_.size() + indent_size);

  UpdateMetadata(data_, pos, data_.size() + indent_size, indent_.size());
}